

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

iterator __thiscall
QJsonObject::insertImpl<QStringView>(QJsonObject *this,QStringView key,QJsonValue *value)

{
  bool bVar1;
  Type TVar2;
  qsizetype in_RDX;
  QJsonValue *in_RSI;
  QJsonObject *in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef QVar3;
  QStringView in_stack_00000000;
  QStringView in_stack_00000018;
  qsizetype pos;
  bool keyExists;
  QJsonObject *in_stack_ffffffffffffff78;
  QJsonObject *keyExists_00;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 keyExists_01;
  QJsonObject *this_00;
  
  keyExists_01 = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
  this_00 = *(QJsonObject **)(in_FS_OFFSET + 0x28);
  keyExists_00 = in_RDI;
  TVar2 = QJsonValue::type((QJsonValue *)0x4943ca);
  if (TVar2 == Undefined) {
    remove(in_RDI,(char *)in_RSI);
    QVar3 = (QJsonValueConstRef)end(in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494427);
    if (bVar1) {
      indexOf<QStringView>(in_stack_ffffffffffffffa0,in_stack_00000000,(bool *)keyExists_00);
    }
    QVar3 = (QJsonValueConstRef)
            insertAt<QStringView>(this_00,in_RDX,in_stack_00000018,in_RSI,(bool)keyExists_01);
  }
  if (*(QJsonObject **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return (QJsonValueRef)(QJsonValueRef)QVar3;
}

Assistant:

QJsonObject::iterator QJsonObject::insertImpl(T key, const QJsonValue &value)
{
    if (value.type() == QJsonValue::Undefined) {
        remove(key);
        return end();
    }
    bool keyExists = false;
    auto pos = o ? indexOf(o, key, &keyExists) : 0;
    return insertAt(pos, key, value, keyExists);
}